

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

Map * Map_Copy(Map *cpy)

{
  Map *pMVar1;
  Map *pMVar2;
  long lVar3;
  
  if (cpy == (Map *)0x0) {
    pMVar1 = (Map *)0x0;
  }
  else {
    pMVar1 = (Map *)malloc(0x810);
    pMVar1->is_final = cpy->is_final;
    pMVar1->ID = cpy->ID;
    lVar3 = 1;
    do {
      pMVar2 = Map_Copy(cpy->delta[lVar3 + -1]);
      pMVar1->delta[lVar3 + -1] = pMVar2;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x101);
  }
  return pMVar1;
}

Assistant:

Map* Map_Copy(Map *cpy)
{
	short i;
	Map *ret;

	if(cpy==NULL)
	{
		return NULL;
	}

	ret=malloc(sizeof(Map));
	ret->is_final=cpy->is_final;
	ret->ID=cpy->ID;

	for(i=0;i<256;++i)
	{
		ret->delta[i]=Map_Copy(cpy->delta[i]);
	}
	return ret;
}